

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydatapointer.h
# Opt level: O0

void __thiscall
QArrayDataPointer<std::pair<QString,_QString>_>::relocate
          (QArrayDataPointer<std::pair<QString,_QString>_> *this,qsizetype offset,
          pair<QString,_QString> **data)

{
  bool bVar1;
  long *in_RDX;
  long in_RSI;
  QArrayDataPointer<std::pair<QString,_QString>_> *in_RDI;
  pair<QString,_QString> **unaff_retaddr;
  pair<QString,_QString> *res;
  pair<QString,_QString> *first;
  QArrayDataPointer<std::pair<QString,_QString>_> *c;
  
  first = in_RDI->ptr + in_RSI;
  c = in_RDI;
  QtPrivate::q_relocate_overlap_n<std::pair<QString,QString>,long_long>
            (first,(longlong)in_RDI,(pair<QString,_QString> *)0x176a64);
  if ((in_RDX != (long *)0x0) &&
     (bVar1 = QtPrivate::
              q_points_into_range<QArrayDataPointer<std::pair<QString,QString>>,std::pair<QString,QString>const*>
                        (unaff_retaddr,c), bVar1)) {
    *in_RDX = in_RSI * 0x30 + *in_RDX;
  }
  in_RDI->ptr = first;
  return;
}

Assistant:

void relocate(qsizetype offset, const T **data = nullptr)
    {
        T *res = this->ptr + offset;
        QtPrivate::q_relocate_overlap_n(this->ptr, this->size, res);
        // first update data pointer, then this->ptr
        if (data && QtPrivate::q_points_into_range(*data, *this))
            *data += offset;
        this->ptr = res;
    }